

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

void serializeTest(void)

{
  value_type vVar1;
  initializer_list<double> __l;
  reference pvVar2;
  ostream *this;
  vector<double,_std::allocator<double>_> *pvVar3;
  pointer *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  vector<double,_std::allocator<double>_> local_2e0;
  undefined1 local_2c8 [8];
  NeuralNet nn2;
  vector<double,_std::allocator<double>_> local_290;
  stringstream local_278 [8];
  stringstream ss;
  ostream local_268 [376];
  vector<double,_std::allocator<double>_> local_f0;
  value_type local_d8;
  double output;
  double local_c8 [6];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> input;
  NeuralNet nn;
  int local_48 [8];
  activationType local_28 [2];
  undefined1 local_20 [8];
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> layerDefs;
  
  std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::vector
            ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)local_20
            );
  local_28[1] = 0x32;
  local_28[0] = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             (int *)(local_28 + 1),local_28);
  local_48[4] = 0x32;
  local_48[3] = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             (int *)((long)local_48 + 0x10),(activationType *)((long)local_48 + 0xc));
  local_48[2] = 0x32;
  local_48[1] = relu;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             (int *)((long)local_48 + 8),(activationType *)((long)local_48 + 4));
  local_48[0] = 2;
  nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)local_20,
             local_48,(activationType *)
                      ((long)&nn.layers.
                              super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  PyreNet::NeuralNet::NeuralNet
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,5,
             (vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)local_20
            );
  PyreNet::NeuralNet::mutate_uniform
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,2.0,-1);
  local_c8[2] = 2.0;
  local_c8[3] = 3.0;
  local_c8[0] = 0.0;
  local_c8[1] = 1.0;
  local_c8[4] = 4.0;
  local_98 = local_c8;
  local_90 = 5;
  std::allocator<double>::allocator((allocator<double> *)((long)&output + 7));
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,__l,
             (allocator<double> *)((long)&output + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&output + 7));
  PyreNet::NeuralNet::predict
            (&local_f0,
             (NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_88);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_f0,0);
  vVar1 = *pvVar2;
  std::vector<double,_std::allocator<double>_>::~vector(&local_f0);
  local_d8 = vVar1;
  std::__cxx11::stringstream::stringstream(local_278);
  PyreNet::operator<<(local_268,
                      (NeuralNet *)
                      &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::mutate_uniform
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2.0,2.0,-1);
  PyreNet::NeuralNet::predict
            (&local_290,
             (NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_88);
  pvVar3 = &local_290;
  std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  std::abs((int)pvVar3);
  std::vector<double,_std::allocator<double>_>::~vector(&local_290);
  if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= 1.0) {
    exit(1);
  }
  PyreNet::operator>>((istream *)local_278,
                      (NeuralNet *)
                      &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::predict
            ((vector<double,_std::allocator<double>_> *)
             &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_88);
  this_00 = &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)this_00,0);
  std::abs((int)this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &nn2.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  if (1.0 < (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) {
    exit(1);
  }
  PyreNet::operator<<(local_268,
                      (NeuralNet *)
                      &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::NeuralNet((NeuralNet *)local_2c8,(istream *)local_278);
  PyreNet::NeuralNet::predict
            (&local_2e0,(NeuralNet *)local_2c8,(vector<double,_std::allocator<double>_> *)local_88);
  pvVar3 = &local_2e0;
  std::vector<double,_std::allocator<double>_>::operator[](pvVar3,0);
  std::abs((int)pvVar3);
  std::vector<double,_std::allocator<double>_>::~vector(&local_2e0);
  if (1.0 < (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) {
    exit(1);
  }
  this = std::operator<<((ostream *)&std::cout,"Serialize test complete");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  PyreNet::NeuralNet::~NeuralNet((NeuralNet *)local_2c8);
  std::__cxx11::stringstream::~stringstream(local_278);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  PyreNet::NeuralNet::~NeuralNet
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_>::~vector
            ((vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)local_20
            );
  return;
}

Assistant:

void serializeTest() {
    std::vector<PyreNet::LayerDefinition> layerDefs;
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(2, PyreNet::LayerDefinition::activationType::relu);
    PyreNet::NeuralNet nn(5, layerDefs);
    nn.mutate_uniform(0,2);
    std::vector<double> input{0,1,2,3,4};
    double output = nn.predict(input)[0];

    std::stringstream ss;
    ss << nn;

    nn.mutate_uniform(2,2);
    if (std::abs(nn.predict(input)[0] - output) <= 1)
        exit(EXIT_FAILURE);

    ss >> nn;
    if (std::abs(nn.predict(input)[0] - output) > 1)
        exit(EXIT_FAILURE);

    ss << nn;
    PyreNet::NeuralNet nn2(ss);
    if (std::abs(nn2.predict(input)[0] - output) > 1)
        exit(EXIT_FAILURE);

    std::cout << "Serialize test complete" << std::endl;
}